

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O2

string * __thiscall
polyscope::renderDataTypeName_abi_cxx11_
          (string *__return_storage_ptr__,polyscope *this,RenderDataType *r)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_13;
  allocator local_12;
  allocator local_11;
  allocator local_10;
  allocator local_f;
  allocator local_e;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch(*(undefined4 *)this) {
  case 0:
    pcVar2 = "Vector2Float";
    paVar1 = &local_9;
    break;
  case 1:
    pcVar2 = "Vector3Float";
    paVar1 = &local_a;
    break;
  case 2:
    pcVar2 = "Vector4Float";
    paVar1 = &local_b;
    break;
  case 3:
    pcVar2 = "Matrix44Float";
    paVar1 = &local_c;
    break;
  case 4:
    pcVar2 = "Float";
    paVar1 = &local_d;
    break;
  case 5:
    pcVar2 = "Int";
    paVar1 = &local_e;
    break;
  case 6:
    pcVar2 = "UInt";
    paVar1 = &local_f;
    break;
  case 7:
    pcVar2 = "Vector2UInt";
    paVar1 = &local_10;
    break;
  case 8:
    pcVar2 = "Vector3UInt";
    paVar1 = &local_11;
    break;
  case 9:
    pcVar2 = "Vector4UInt";
    paVar1 = &local_12;
    break;
  default:
    pcVar2 = "";
    paVar1 = &local_13;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string renderDataTypeName(const RenderDataType& r) {
  switch (r) {
  case RenderDataType::Vector2Float:
    return "Vector2Float";
  case RenderDataType::Vector3Float:
    return "Vector3Float";
  case RenderDataType::Vector4Float:
    return "Vector4Float";
  case RenderDataType::Matrix44Float:
    return "Matrix44Float";
  case RenderDataType::Float:
    return "Float";
  case RenderDataType::Int:
    return "Int";
  case RenderDataType::UInt:
    return "UInt";
  case RenderDataType::Vector2UInt:
    return "Vector2UInt";
  case RenderDataType::Vector3UInt:
    return "Vector3UInt";
  case RenderDataType::Vector4UInt:
    return "Vector4UInt";
  }
  return "";
}